

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::paintEvent(QLineEdit *this,QPaintEvent *param_1)

{
  int iVar1;
  QLineEditPrivate *this_00;
  qreal qVar2;
  ulong uVar3;
  qsizetype qVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  Alignment AVar8;
  Alignment AVar9;
  undefined4 uVar10;
  QPalette *pQVar11;
  QStyle *pQVar12;
  int extraout_var;
  int extraout_var_00;
  long *plVar13;
  QPen *pQVar14;
  QStyleSheetStyle *this_01;
  int extraout_var_01;
  int extraout_var_02;
  char16_t *extraout_RDX;
  int iVar15;
  int iVar16;
  LayoutDirection LVar17;
  int iVar18;
  QWidgetLineControl *this_02;
  long in_FS_OFFSET;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  QMargins QVar22;
  QPen oldpen;
  QFontMetrics fm;
  QPainter p;
  QStyleOptionFrame panel;
  QArrayData *local_148;
  char16_t *pcStack_140;
  qsizetype local_138;
  QString local_128;
  QStringBuilder<QString,_QString> local_108;
  undefined1 *local_d8;
  QRect local_d0;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  QPalettePrivate *pQStack_90;
  undefined1 *local_88;
  QObject *pQStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [16];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  local_c0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)local_c0,&(this->super_QWidget).super_QPaintDevice);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar11 = QWidget::palette(&this->super_QWidget);
  QPalette::QPalette((QPalette *)local_68,pQVar11);
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_b8);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionFrame *)local_b8);
  pQVar12 = QWidget::style(&this->super_QWidget);
  (**(code **)(*(long *)pQVar12 + 0xb0))
            (pQVar12,0x12,(QStyleOptionFrame *)local_b8,(QRect *)local_c0,this);
  pQVar12 = QWidget::style(&this->super_QWidget);
  auVar21 = (**(code **)(*(long *)pQVar12 + 0xc0))(pQVar12,0x1a,(QStyleOptionFrame *)local_b8,this);
  QVar22 = QLineEditPrivate::effectiveTextMargins(this_00);
  local_d0._0_8_ =
       (ulong)(uint)(QVar22.m_left.m_i.m_i + auVar21._0_4_) |
       (auVar21._0_8_ & 0xffffffff00000000) + QVar22._0_8_ & 0xffffffff00000000;
  local_d0._8_8_ =
       (ulong)(uint)(auVar21._8_4_ - QVar22.m_right.m_i) |
       auVar21._8_8_ - (QVar22._8_8_ & 0xffffffff00000000) & 0xffffffff00000000;
  QPainter::setClipRect((QRect *)local_c0,(ClipOperation)&local_d0);
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_d8,&((this->super_QWidget).data)->fnt);
  QWidgetLineControl::text(&local_108.a,(QWidgetLineControl *)this_00->control);
  if ((undefined1 *)local_108.a.d.size == (undefined1 *)0x0) {
    QTextLayout::preeditAreaText();
    if (local_58.d.size == 0) {
      bVar19 = true;
      if ((this_00->alignment & 4) != 0) {
        bVar19 = QWidget::hasFocus(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8);
        bVar19 = !bVar19;
      }
    }
    else {
      bVar19 = false;
    }
    if ((QPoint)local_58.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
      UNLOCK();
      if (*(int *)local_58.d.d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar19 = false;
  }
  if (&(local_108.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (bVar19) {
    QFontMetrics::boundingRect((QString *)&local_d8);
    iVar18 = extraout_var_01 - extraout_var;
  }
  else {
    QWidgetLineControl::text(&local_128,(QWidgetLineControl *)this_00->control);
    QTextLayout::preeditAreaText();
    local_108.a.d.size = local_128.d.size;
    local_108.a.d.ptr = local_128.d.ptr;
    local_108.a.d.d = local_128.d.d;
    local_108.b.d.size = local_138;
    local_108.b.d.ptr = pcStack_140;
    local_108.b.d.d = (Data *)local_148;
    local_128.d.d = (Data *)0x0;
    local_128.d.ptr = (char16_t *)0x0;
    local_128.d.size = 0;
    local_148 = (QArrayData *)0x0;
    pcStack_140 = (char16_t *)0x0;
    local_138 = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>(&local_58,&local_108);
    QFontMetrics::boundingRect((QString *)&local_d8);
    if ((QPoint)local_58.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
      UNLOCK();
      if (*(int *)local_58.d.d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_108);
    if (local_148 != (QArrayData *)0x0) {
      LOCK();
      (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_148,2,0x10);
      }
    }
    iVar18 = extraout_var_02 - extraout_var_00;
    if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar7 = QFontMetrics::height();
  if (iVar7 < iVar18 + 1) {
    iVar7 = iVar18 + 1;
  }
  LVar17 = this_00->control->m_layoutDirection;
  if (LVar17 == LayoutDirectionAuto) {
    if ((this_00->control->m_text).d.size == 0) {
      LVar17 = LayoutDirectionAuto;
    }
    else {
      bVar5 = QString::isRightToLeft();
      LVar17 = (LayoutDirection)bVar5;
    }
  }
  AVar8 = QStyle::visualAlignment(LVar17,(Alignment)this_00->alignment);
  if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0) == 0x20) {
    iVar18 = local_d0.y1.m_i + 1;
  }
  else if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0) == 0x40) {
    iVar18 = (local_d0.y2.m_i - (iVar7 + 1)) + 1;
  }
  else {
    iVar18 = (local_d0.y2.m_i - iVar7) - local_d0.y1.m_i;
    iVar18 = ((iVar18 - (iVar18 + 2 >> 0x1f)) + 2 >> 1) + local_d0.y1.m_i;
  }
  this_00->vscroll = iVar18;
  local_128.d.d = (Data *)CONCAT44(iVar18,local_d0.x1.m_i + 2);
  local_128.d.ptr = (char16_t *)CONCAT44(iVar18 + iVar7 + -1,local_d0.x2.m_i + -2);
  QWidgetLineControl::text(&local_108.a,(QWidgetLineControl *)this_00->control);
  if ((undefined1 *)local_108.a.d.size == (undefined1 *)0x0) {
    QTextLayout::preeditAreaText();
    if (local_58.d.size == 0) {
      bVar19 = true;
      if ((this_00->alignment & 4) != 0) {
        bVar19 = QWidget::hasFocus(*(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8);
        bVar19 = !bVar19;
      }
    }
    else {
      bVar19 = false;
    }
    if ((QPoint)local_58.d.d != (QPoint)0x0) {
      LOCK();
      *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
      UNLOCK();
      if (*(int *)local_58.d.d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar19 = false;
  }
  if (&(local_108.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((bVar19) && ((this_00->placeholderText).d.size != 0)) {
    bVar5 = QString::isRightToLeft();
    AVar9 = QStyle::visualAlignment((uint)bVar5,(Alignment)this_00->alignment);
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    plVar13 = (long *)QPalette::brush((ColorGroup)local_68,Dark);
    local_58.d.d = *(Data **)(*plVar13 + 8);
    local_58.d.ptr = *(char16_t **)(*plVar13 + 0x10);
    local_148 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar14 = (QPen *)QPainter::pen();
    QPen::QPen((QPen *)&local_148,pQVar14);
    QPainter::setPen((QColor *)local_c0);
    QPainter::layoutDirection();
    LVar17 = (LayoutDirection)(QRect *)local_c0;
    QPainter::setLayoutDirection(LVar17);
    local_108.a.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_108.a.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_108.a.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::elidedText((QString *)&local_108,(TextElideMode)&local_d8,(int)this_00 + 0x2a8,1);
    QPainter::drawText((QRect *)local_c0,(int)&local_128,
                       (QString *)
                       (ulong)(uint)AVar9.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                                    super_QFlagsStorage<Qt::AlignmentFlag>.i,(QRect *)&local_108);
    QPainter::setPen((QPen *)local_c0);
    QPainter::setLayoutDirection(LVar17);
    if (&(local_108.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    QPen::~QPen((QPen *)&local_148);
  }
  qVar2 = QWidgetLineControl::cursorToX((QWidgetLineControl *)this_00->control);
  uVar10 = QTextLayout::lineAt((int)this_00->control + 0x118);
  local_108.a.d.d = (Data *)CONCAT44(local_108.a.d.d._4_4_,uVar10);
  local_108.a.d.ptr = extraout_RDX;
  dVar20 = (double)QTextLine::naturalTextWidth();
  iVar16 = (int)((double)(((ulong)dVar20 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) +
                dVar20);
  iVar18 = (int)local_128.d.d;
  iVar7 = ((int)local_128.d.ptr - (int)local_128.d.d) + 1;
  if (iVar16 < iVar7) {
    if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xfffffe0f) == 4) {
      iVar15 = ((iVar16 + 1) - iVar7) / 2;
      goto LAB_0041af33;
    }
    if (((uint)AVar8.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xfffffe0f) == 2) {
LAB_0041ae35:
      iVar15 = (iVar16 - iVar7) + 2;
      this_00->hscroll = iVar15;
    }
    else {
      this_00->hscroll = 0;
      iVar15 = 0;
    }
  }
  else {
    iVar15 = (int)((double)((ulong)qVar2 & 0x8000000000000000 | 0x3fe0000000000000) + qVar2);
    iVar1 = this_00->hscroll;
    if (iVar15 - iVar1 < iVar7) {
      if ((iVar1 <= iVar15) || (iVar16 < iVar1)) {
        if ((iVar16 + 1) - iVar1 < iVar7) goto LAB_0041ae35;
        iVar15 = 0;
        if (0 < iVar1) {
          iVar15 = iVar1;
        }
      }
    }
    else {
      iVar15 = (iVar15 - iVar7) + 1;
    }
LAB_0041af33:
    this_00->hscroll = iVar15;
  }
  iVar7 = this_00->control->m_ascent;
  uVar3 = (ulong)local_128.d.d >> 0x20;
  iVar16 = QFontMetrics::ascent();
  local_58.d.d._0_4_ = iVar18 - iVar15;
  local_58.d.d._4_4_ = iVar16 + ((int)uVar3 - iVar7);
  QWidget::style(&this->super_QWidget);
  this_01 = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (this_01 != (QStyleSheetStyle *)0x0) {
    QStyleSheetStyle::styleSheetPalette
              (this_01,&this->super_QWidget,(QStyleOption *)local_b8,(QPalette *)local_68);
  }
  QPalette::brush((ColorGroup)local_68,Dark);
  QPainter::setPen((QColor *)local_c0);
  this_02 = this_00->control;
  if (((this_02->m_text).d.size == 0) || (this_02->m_selend <= this_02->m_selstart)) {
    iVar18 = 1;
    if ((this_00->field_0x27c & 4) == 0) goto LAB_0041b0bb;
    QWidgetLineControl::inputMask(&local_108.a,(QWidgetLineControl *)this_02);
    if ((undefined1 *)local_108.a.d.size == (undefined1 *)0x0) {
      bVar19 = false;
    }
    else {
      bVar19 = (this_00->control->field_0x50 & 4) == 0;
    }
    if (&(local_108.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    this_02 = this_00->control;
    if (!bVar19) goto LAB_0041b0bb;
  }
  cVar6 = QPalette::operator==(&this_02->m_palette,(QPalette *)local_68);
  this_02 = this_00->control;
  if ((cVar6 == '\0') || (iVar18 = 3, (this_02->m_palette).currentGroup != local_68._8_4_)) {
    QPalette::operator=(&this_02->m_palette,(QPalette *)local_68);
    this_02 = this_00->control;
    iVar18 = 3;
  }
LAB_0041b0bb:
  if (((this_00->field_0x27c & 4) != 0) && ((this_02->field_0x50 & 4) == 0)) {
    QWidgetLineControl::inputMask(&local_108.a,(QWidgetLineControl *)this_02);
    qVar4 = local_108.a.d.size;
    if (&(local_108.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar7 = iVar18 + 4;
    if ((undefined1 *)qVar4 != (undefined1 *)0x0) {
      iVar7 = iVar18;
    }
    iVar18 = iVar7;
    this_02 = this_00->control;
  }
  pQVar12 = QWidget::style(&this->super_QWidget);
  iVar7 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x52,(QStyleOption *)local_b8,this);
  this_02->m_cursorWidth = iVar7;
  QWidgetLineControl::draw
            ((QWidgetLineControl *)this_00->control,(QPainter *)local_c0,(QPoint *)&local_58,
             &local_d0,iVar18);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_d8);
  QStyleOption::~QStyleOption((QStyleOption *)local_b8);
  QPalette::~QPalette((QPalette *)local_68);
  QPainter::~QPainter((QPainter *)local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::paintEvent(QPaintEvent *)
{
    Q_D(QLineEdit);
    QPainter p(this);
    QPalette pal = palette();

    QStyleOptionFrame panel;
    initStyleOption(&panel);
    style()->drawPrimitive(QStyle::PE_PanelLineEdit, &panel, &p, this);
    QRect r = style()->subElementRect(QStyle::SE_LineEditContents, &panel, this);
    r = r.marginsRemoved(d->effectiveTextMargins());
    p.setClipRect(r);

    QFontMetrics fm = fontMetrics();
    int fmHeight = 0;
    if (d->shouldShowPlaceholderText())
        fmHeight = fm.boundingRect(d->placeholderText).height();
    else
        fmHeight = fm.boundingRect(d->control->text() + d->control->preeditAreaText()).height();
    fmHeight = qMax(fmHeight, fm.height());

    Qt::Alignment va = QStyle::visualAlignment(d->control->layoutDirection(), QFlag(d->alignment));
    switch (va & Qt::AlignVertical_Mask) {
     case Qt::AlignBottom:
         d->vscroll = r.y() + r.height() - fmHeight - QLineEditPrivate::verticalMargin;
         break;
     case Qt::AlignTop:
         d->vscroll = r.y() + QLineEditPrivate::verticalMargin;
         break;
     default:
         //center
         d->vscroll = r.y() + (r.height() - fmHeight + 1) / 2;
         break;
    }
    QRect lineRect(r.x() + QLineEditPrivate::horizontalMargin, d->vscroll,
                   r.width() - 2 * QLineEditPrivate::horizontalMargin, fmHeight);

    if (d->shouldShowPlaceholderText()) {
        if (!d->placeholderText.isEmpty()) {
            const Qt::LayoutDirection layoutDir = d->placeholderText.isRightToLeft() ? Qt::RightToLeft : Qt::LeftToRight;
            const Qt::Alignment alignPhText = QStyle::visualAlignment(layoutDir, QFlag(d->alignment));
            const QColor col = pal.placeholderText().color();
            QPen oldpen = p.pen();
            p.setPen(col);
            Qt::LayoutDirection oldLayoutDir = p.layoutDirection();
            p.setLayoutDirection(layoutDir);

            const QString elidedText = fm.elidedText(d->placeholderText, Qt::ElideRight, lineRect.width());
            p.drawText(lineRect, alignPhText, elidedText);
            p.setPen(oldpen);
            p.setLayoutDirection(oldLayoutDir);
        }
    }

    int cix = qRound(d->control->cursorToX());

    // horizontal scrolling. d->hscroll is the left indent from the beginning
    // of the text line to the left edge of lineRect. we update this value
    // depending on the delta from the last paint event; in effect this means
    // the below code handles all scrolling based on the textline (widthUsed),
    // the line edit rect (lineRect) and the cursor position (cix).
    int widthUsed = qRound(d->control->naturalTextWidth()) + 1;
    if (widthUsed <= lineRect.width()) {
        // text fits in lineRect; use hscroll for alignment
        switch (va & ~(Qt::AlignAbsolute|Qt::AlignVertical_Mask)) {
        case Qt::AlignRight:
            d->hscroll = widthUsed - lineRect.width() + 1;
            break;
        case Qt::AlignHCenter:
            d->hscroll = (widthUsed - lineRect.width()) / 2;
            break;
        default:
            // Left
            d->hscroll = 0;
            break;
        }
    } else if (cix - d->hscroll >= lineRect.width()) {
        // text doesn't fit, cursor is to the right of lineRect (scroll right)
        d->hscroll = cix - lineRect.width() + 1;
    } else if (cix - d->hscroll < 0 && d->hscroll < widthUsed) {
        // text doesn't fit, cursor is to the left of lineRect (scroll left)
        d->hscroll = cix;
    } else if (widthUsed - d->hscroll < lineRect.width()) {
        // text doesn't fit, text document is to the left of lineRect; align
        // right
        d->hscroll = widthUsed - lineRect.width() + 1;
    } else {
        //in case the text is bigger than the lineedit, the hscroll can never be negative
        d->hscroll = qMax(0, d->hscroll);
    }

    // the y offset is there to keep the baseline constant in case we have script changes in the text.
    // Needs to be kept in sync with QLineEditPrivate::adjustedControlRect
    QPoint topLeft = lineRect.topLeft() - QPoint(d->hscroll, d->control->ascent() - fm.ascent());

    // draw text, selections and cursors
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle* cssStyle = qt_styleSheet(style())) {
        cssStyle->styleSheetPalette(this, &panel, &pal);
    }
#endif
    p.setPen(pal.text().color());

    int flags = QWidgetLineControl::DrawText;

#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || hasEditFocus())
#endif
    if (d->control->hasSelectedText() || (d->cursorVisible && !d->control->inputMask().isEmpty() && !d->control->isReadOnly())){
        flags |= QWidgetLineControl::DrawSelections;
        // Palette only used for selections/mask and may not be in sync
        if (d->control->palette() != pal
           || d->control->palette().currentColorGroup() != pal.currentColorGroup())
            d->control->setPalette(pal);
    }

    // Asian users see an IM selection text as cursor on candidate
    // selection phase of input method, so the ordinary cursor should be
    // invisible if we have a preedit string. another condition is when inputmask
    // isn't empty,we don't need draw cursor,because cursor and character overlapping
    // area is white.
    if (d->cursorVisible && !d->control->isReadOnly() && d->control->inputMask().isEmpty())
        flags |= QWidgetLineControl::DrawCursor;

    d->control->setCursorWidth(style()->pixelMetric(QStyle::PM_TextCursorWidth, &panel, this));
    d->control->draw(&p, topLeft, r, flags);

}